

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyGeneratedClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  long lVar6;
  string classname;
  __string_type __str;
  string *local_a0;
  string *local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string *local_60;
  Descriptor *local_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  local_a0 = (string *)local_90;
  lVar6 = **(long **)(desc + 8);
  local_60 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,lVar6,(*(long **)(desc + 8))[1] + lVar6);
  lVar6 = *(long *)(desc + 0x18);
  local_58 = desc;
  if (lVar6 != 0) {
    do {
      lVar1 = **(long **)(lVar6 + 8);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar1,(*(long **)(lVar6 + 8))[1] + lVar1);
      std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_a0);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar4) {
        local_70._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_70._8_8_ = plVar2[3];
        local_80._M_allocated_capacity = (size_type)&local_70;
      }
      else {
        local_70._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_80._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar2;
      }
      local_80._8_8_ = plVar2[1];
      *plVar2 = (long)paVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)(local_90 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_allocated_capacity != &local_70) {
        operator_delete((void *)local_80._M_allocated_capacity);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      lVar6 = *(long *)(lVar6 + 0x18);
    } while (lVar6 != 0);
  }
  ClassNamePrefix<google::protobuf::Descriptor>
            ((string *)(local_90 + 0x10),(anon_unknown_2 *)local_a0,local_98,
             *(Descriptor **)(local_58 + 0x10));
  plVar2 = (long *)std::__cxx11::string::_M_append(local_90 + 0x10,(ulong)local_a0);
  (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar6 = plVar2[3];
    (local_60->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&local_60->field_2 + 8) = lVar6;
  }
  else {
    (local_60->_M_dataplus)._M_p = (pointer)*plVar2;
    (local_60->field_2)._M_allocated_capacity = *psVar5;
  }
  local_60->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_allocated_capacity != &local_70) {
    operator_delete((void *)local_80._M_allocated_capacity);
  }
  psVar3 = (string *)local_90;
  if (local_a0 != psVar3) {
    operator_delete(local_a0);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string LegacyGeneratedClassName(const DescriptorType* desc) {
  std::string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  return ClassNamePrefix(classname, desc) + classname;
}